

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O0

bool bssl::spake2plus::anon_unknown_0::ComputeTranscript
               (uint8_t *out_prover_confirm,uint8_t *out_verifier_confirm,uint8_t *out_secret,
               uint8_t *prover_share,uint8_t *verifier_share,SHA256_CTX *sha,EC_AFFINE *Z,
               EC_AFFINE *V,EC_SCALAR *w0)

{
  int iVar1;
  EC_GROUP *group_00;
  size_t sVar2;
  EVP_MD *pEVar3;
  uchar *puVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  size_t sVar5;
  Span<unsigned_char> out_buf;
  string_view s;
  string_view s_00;
  Span<const_unsigned_char> data;
  Span<const_unsigned_char> data_00;
  Span<const_unsigned_char> data_01;
  Span<const_unsigned_char> data_02;
  Span<const_unsigned_char> data_03;
  uint local_220;
  uint local_21c;
  uint verifier_confirm_len;
  uint prover_confirm_len;
  char *local_210;
  undefined1 local_208 [8];
  Span<const_unsigned_char> secret_info_str;
  uint8_t keys [64];
  size_t local_1b0;
  undefined1 local_1a8 [8];
  Span<const_unsigned_char> confirmation_str;
  uchar *local_190;
  SHA256_CTX *local_188;
  uchar *local_180;
  SHA256_CTX *local_178;
  uchar *local_170;
  Span<const_unsigned_char> local_168;
  Span<const_unsigned_char> local_158;
  uchar local_148 [8];
  uint8_t K_main [32];
  uchar *local_120;
  uchar local_118 [8];
  uint8_t w0_enc [32];
  size_t V_enc_len;
  uint8_t V_enc [65];
  size_t Z_enc_len;
  uint8_t Z_enc [65];
  EC_GROUP *group;
  SHA256_CTX *sha_local;
  uint8_t *verifier_share_local;
  uint8_t *prover_share_local;
  uint8_t *out_secret_local;
  uint8_t *out_verifier_confirm_local;
  uint8_t *out_prover_confirm_local;
  
  group_00 = EC_group_p256();
  register0x00000000 =
       ec_point_to_bytes(group_00,Z,POINT_CONVERSION_UNCOMPRESSED,(uint8_t *)&Z_enc_len,0x41);
  if (register0x00000000 != 0x41) {
    abort();
  }
  sVar5 = 0x41;
  sVar2 = ec_point_to_bytes(group_00,V,POINT_CONVERSION_UNCOMPRESSED,(uint8_t *)&V_enc_len,0x41);
  if (sVar2 != 0x41) {
    abort();
  }
  Span<unsigned_char>::Span<32ul>((Span<unsigned_char> *)(K_main + 0x18),(uchar (*) [32])local_118);
  out_buf.size_ = sVar5;
  out_buf.data_ = local_120;
  ScalarToSizedBuffer((anon_unknown_0 *)group_00,(EC_GROUP *)w0,(EC_SCALAR *)K_main._24_8_,out_buf);
  Span<const_unsigned_char>::Span(&local_158,prover_share,0x41);
  data.size_ = (size_t)local_120;
  data.data_ = (uchar *)local_158.size_;
  UpdateWithLengthPrefix((anon_unknown_0 *)sha,(SHA256_CTX *)local_158.data_,data);
  Span<const_unsigned_char>::Span(&local_168,verifier_share,0x41);
  data_00.size_ = (size_t)local_120;
  data_00.data_ = (uchar *)local_168.size_;
  UpdateWithLengthPrefix((anon_unknown_0 *)sha,(SHA256_CTX *)local_168.data_,data_00);
  Span<unsigned_char_const>::Span<65ul>
            ((Span<unsigned_char_const> *)&local_178,(uchar (*) [65])&Z_enc_len);
  data_01.size_ = (size_t)local_120;
  data_01.data_ = local_170;
  UpdateWithLengthPrefix((anon_unknown_0 *)sha,local_178,data_01);
  Span<unsigned_char_const>::Span<65ul>
            ((Span<unsigned_char_const> *)&local_188,(uchar (*) [65])&V_enc_len);
  data_02.size_ = (size_t)local_120;
  data_02.data_ = local_180;
  UpdateWithLengthPrefix((anon_unknown_0 *)sha,local_188,data_02);
  Span<unsigned_char_const>::Span<32ul>
            ((Span<unsigned_char_const> *)&confirmation_str.size_,(uchar (*) [32])local_118);
  data_03.size_ = (size_t)local_120;
  data_03.data_ = local_190;
  UpdateWithLengthPrefix((anon_unknown_0 *)sha,(SHA256_CTX *)confirmation_str.size_,data_03);
  SHA256_Final(local_148,(SHA256_CTX *)sha);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(keys + 0x38),"ConfirmationKeys");
  s._M_str = extraout_RDX;
  s._M_len = local_1b0;
  _local_1a8 = StringAsBytes((bssl *)keys._56_8_,s);
  pEVar3 = EVP_sha256();
  puVar4 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_1a8);
  sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_1a8);
  iVar1 = HKDF((uint8_t *)&secret_info_str.size_,0x40,(EVP_MD *)pEVar3,local_148,0x20,(uint8_t *)0x0
               ,0,puVar4,sVar2);
  if (iVar1 == 0) {
    out_prover_confirm_local._7_1_ = false;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&verifier_confirm_len,"SharedKey"
              );
    s_00._M_str = extraout_RDX_00;
    s_00._M_len = (size_t)local_210;
    _local_208 = StringAsBytes(_verifier_confirm_len,s_00);
    pEVar3 = EVP_sha256();
    puVar4 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_208);
    sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_208);
    iVar1 = HKDF(out_secret,0x20,(EVP_MD *)pEVar3,local_148,0x20,(uint8_t *)0x0,0,puVar4,sVar2);
    if (iVar1 == 0) {
      out_prover_confirm_local._7_1_ = false;
    }
    else {
      pEVar3 = EVP_sha256();
      puVar4 = HMAC(pEVar3,&secret_info_str.size_,0x20,verifier_share,0x41,out_prover_confirm,
                    &local_21c);
      if (puVar4 == (uchar *)0x0) {
        out_prover_confirm_local._7_1_ = false;
      }
      else {
        if (local_21c != 0x20) {
          abort();
        }
        pEVar3 = EVP_sha256();
        puVar4 = HMAC(pEVar3,keys + 0x18,0x20,prover_share,0x41,out_verifier_confirm,&local_220);
        if (puVar4 == (uchar *)0x0) {
          out_prover_confirm_local._7_1_ = false;
        }
        else {
          if (local_220 != 0x20) {
            abort();
          }
          out_prover_confirm_local._7_1_ = true;
        }
      }
    }
  }
  return out_prover_confirm_local._7_1_;
}

Assistant:

bool ComputeTranscript(uint8_t out_prover_confirm[kConfirmSize],
                       uint8_t out_verifier_confirm[kConfirmSize],
                       uint8_t out_secret[kSecretSize],
                       const uint8_t prover_share[kShareSize],
                       const uint8_t verifier_share[kShareSize],
                       SHA256_CTX *sha, const EC_AFFINE *Z, const EC_AFFINE *V,
                       const EC_SCALAR *w0) {
  const EC_GROUP *group = EC_group_p256();

  uint8_t Z_enc[kShareSize];
  size_t Z_enc_len = ec_point_to_bytes(group, Z, POINT_CONVERSION_UNCOMPRESSED,
                                       Z_enc, sizeof(Z_enc));
  BSSL_CHECK(Z_enc_len == sizeof(Z_enc));

  uint8_t V_enc[kShareSize];
  size_t V_enc_len = ec_point_to_bytes(group, V, POINT_CONVERSION_UNCOMPRESSED,
                                       V_enc, sizeof(V_enc));
  BSSL_CHECK(V_enc_len == sizeof(V_enc));

  uint8_t w0_enc[kVerifierSize];
  ScalarToSizedBuffer(group, w0, w0_enc);

  uint8_t K_main[SHA256_DIGEST_LENGTH];
  UpdateWithLengthPrefix(sha, Span(prover_share, kShareSize));
  UpdateWithLengthPrefix(sha, Span(verifier_share, kShareSize));
  UpdateWithLengthPrefix(sha, Z_enc);
  UpdateWithLengthPrefix(sha, V_enc);
  UpdateWithLengthPrefix(sha, w0_enc);
  SHA256_Final(K_main, sha);

  auto confirmation_str = StringAsBytes("ConfirmationKeys");
  uint8_t keys[kSecretSize * 2];
  if (!HKDF(keys, sizeof(keys), EVP_sha256(), K_main, sizeof(K_main), nullptr,
            0, confirmation_str.data(), confirmation_str.size())) {
    return false;
  }

  auto secret_info_str = StringAsBytes("SharedKey");
  if (!HKDF(out_secret, kSecretSize, EVP_sha256(), K_main, sizeof(K_main),
            nullptr, 0, secret_info_str.data(), secret_info_str.size())) {
    return false;
  }

  unsigned prover_confirm_len;
  if (HMAC(EVP_sha256(), keys, kSecretSize, verifier_share, kShareSize,
           out_prover_confirm, &prover_confirm_len) == nullptr) {
    return false;
  }
  BSSL_CHECK(prover_confirm_len == kConfirmSize);

  unsigned verifier_confirm_len;
  if (HMAC(EVP_sha256(), keys + kSecretSize, kSecretSize, prover_share,
           kShareSize, out_verifier_confirm,
           &verifier_confirm_len) == nullptr) {
    return false;
  }
  BSSL_CHECK(verifier_confirm_len == kConfirmSize);

  return true;
}